

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_sum.hpp
# Opt level: O2

void __thiscall
ranges::
partial_sum_view<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>,_std::plus<void>_>
::cursor<false>::cursor(cursor<false> *this,Parent *rng)

{
  iterator_t<Base> *this_00;
  bool bVar1;
  semiregular_box_t<range_value_t<concat_view<single_view<int>,_ref_view<array<int,_12UL>_>_>_>_>
  *psVar2;
  size_t in_RCX;
  void *__buf;
  int __fd;
  basic_iterator<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
  local_38;
  
  __fd = (int)&local_38;
  this->parent_ = rng;
  this_00 = &this->current_;
  view_facade<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>,_(ranges::cardinality)13>
  ::begin<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>_>
            (this_00,(view_facade<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>,_(ranges::cardinality)13>
                      *)&rng->base_);
  local_38.
  super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
  .
  super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void>
  .
  super_mixin_base_t<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
  .
  super_box<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
  .value.its_.super_variant_data<int_*,_int_*>.field_0 =
       (anon_union_8_2_3194c211_for_type_0)
       ((rng->base_).rngs_.
        super__Tuple_impl<0UL,_ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>.
        super__Tuple_impl<1UL,_ranges::ref_view<std::array<int,_12UL>_>_>.
        super__Head_base<1UL,_ranges::ref_view<std::array<int,_12UL>_>,_false>._M_head_impl.rng_ + 1
       );
  local_38.
  super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
  .
  super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void>
  .
  super_mixin_base_t<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
  .
  super_box<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
  .value.its_.index_ = 1;
  local_38.
  super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
  .
  super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void>
  .
  super_mixin_base_t<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
  .
  super_box<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
  .value.rng_ = &rng->base_;
  bVar1 = operator!=<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
                    (this_00,&local_38);
  if (bVar1) {
    psVar2 = (semiregular_box_t<range_value_t<concat_view<single_view<int>,_ref_view<array<int,_12UL>_>_>_>_>
              *)concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::
                cursor<false>::read((cursor<false> *)this_00,__fd,__buf,in_RCX);
    this->sum_ = *psVar2;
  }
  return;
}

Assistant:

constexpr explicit cursor(Parent * rng)
              : parent_{rng}
              , current_(ranges::begin(rng->base_))
            {
                if(current_ != ranges::end(rng->base_))
                    sum_ = *current_;
            }